

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall
ExecutionEngine::startExecutionEngine(ExecutionEngine *this,ClassRuntime *classRuntime)

{
  bool bVar1;
  uint32_t uVar2;
  VMStack *this_00;
  ArrayObject *this_01;
  Frame *pFVar3;
  byte *pbVar4;
  long *plVar5;
  code *local_248;
  u1 *code;
  Frame *topFrame;
  vector<Value,_std::allocator<Value>_> local_180;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1;
  vector<Value,_std::allocator<Value>_> local_c0;
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [48];
  undefined1 local_48 [8];
  Value commandLineArgs;
  vector<Value,_std::allocator<Value>_> arguments;
  VMStack *stackFrame;
  ClassRuntime *classRuntime_local;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  std::vector<Value,_std::allocator<Value>_>::vector
            ((vector<Value,_std::allocator<Value>_> *)&commandLineArgs.data);
  local_48._4_4_ = REFERENCE;
  this_01 = (ArrayObject *)operator_new(0x28);
  ArrayObject::ArrayObject(this_01,REFERENCE);
  commandLineArgs._0_8_ = this_01;
  std::vector<Value,_std::allocator<Value>_>::push_back
            ((vector<Value,_std::allocator<Value>_> *)&commandLineArgs.data,(value_type *)local_48);
  pFVar3 = (Frame *)operator_new(0xb8);
  local_c1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"main",&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"([Ljava/lang/String;)V",&local_a1);
  std::vector<Value,_std::allocator<Value>_>::vector
            (&local_c0,(vector<Value,_std::allocator<Value>_> *)&commandLineArgs.data);
  Frame::Frame(pFVar3,classRuntime,(string *)local_78,(string *)local_a0,&local_c0);
  local_c1 = 0;
  VMStack::addFrame(this_00,pFVar3);
  std::vector<Value,_std::allocator<Value>_>::~vector(&local_c0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"<clinit>",&local_e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_110,"()V",&local_111);
  bVar1 = doesMethodExist(this,classRuntime,(string *)local_e8,(string *)local_110);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator((allocator<char> *)&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  if (bVar1) {
    pFVar3 = (Frame *)operator_new(0xb8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"<clinit>",&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"()V",&local_161);
    std::vector<Value,_std::allocator<Value>_>::vector
              (&local_180,(vector<Value,_std::allocator<Value>_> *)&commandLineArgs.data);
    Frame::Frame(pFVar3,classRuntime,(string *)local_138,(string *)local_160,&local_180);
    VMStack::addFrame(this_00,pFVar3);
    std::vector<Value,_std::allocator<Value>_>::~vector(&local_180);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  while (uVar2 = VMStack::size(this_00), uVar2 != 0) {
    pFVar3 = VMStack::getTopFrame(this_00);
    pbVar4 = Frame::getCode(pFVar3,pFVar3->pc);
    local_248 = (code *)this->_instructionFunctions[(ulong)*pbVar4 * 2];
    plVar5 = (long *)((long)this->_instructionFunctions +
                     (this->_instructionFunctions[(ulong)*pbVar4 * 2 + 1] - 8));
    if (((ulong)local_248 & 1) != 0) {
      local_248 = *(code **)(local_248 + *plVar5 + -1);
    }
    (*local_248)(plVar5);
  }
  std::vector<Value,_std::allocator<Value>_>::~vector
            ((vector<Value,_std::allocator<Value>_> *)&commandLineArgs.data);
  return;
}

Assistant:

void ExecutionEngine::startExecutionEngine(ClassRuntime *classRuntime) {
    VMStack &stackFrame = VMStack::getInstance();

    vector<Value> arguments;
    Value commandLineArgs;
    commandLineArgs.type = ValueType::REFERENCE;
    commandLineArgs.data.object = new ArrayObject(ValueType::REFERENCE);
    arguments.push_back(commandLineArgs);

    stackFrame.addFrame(new Frame(classRuntime, "main", "([Ljava/lang/String;)V", arguments));

    if (doesMethodExist(classRuntime, "<clinit>", "()V")) {
        stackFrame.addFrame(new Frame(classRuntime, "<clinit>", "()V", arguments));
    }

    while (stackFrame.size() > 0) {
        Frame *topFrame = stackFrame.getTopFrame();
        u1 *code = topFrame->getCode(topFrame->pc);
        (*this.*_instructionFunctions[code[0]])();
    }
}